

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetupMandatoryFields(FXBase *this)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->outer_class_->super_MandatoryFieldsSubjectCreator).mandatory_keys_,
              (value_type *)&SubjectKey::BUY_SIDE_ACCOUNT_abi_cxx11_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->outer_class_->super_MandatoryFieldsSubjectCreator).mandatory_keys_,
              (value_type *)&SubjectKey::CURRENCY_abi_cxx11_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->outer_class_->super_MandatoryFieldsSubjectCreator).mandatory_keys_,
              (value_type *)&SubjectKey::CURRENCY_PAIR_abi_cxx11_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->outer_class_->super_MandatoryFieldsSubjectCreator).mandatory_keys_,
              (value_type *)&SubjectKey::DEAL_TYPE_abi_cxx11_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->outer_class_->super_MandatoryFieldsSubjectCreator).mandatory_keys_,
              (value_type *)&SubjectKey::QUANTITY_abi_cxx11_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->outer_class_->super_MandatoryFieldsSubjectCreator).mandatory_keys_,
              (value_type *)&SubjectKey::LIQUIDITY_PROVIDER_abi_cxx11_);
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::FXBase::SetupMandatoryFields()
{
    outer_class_.AddMandatoryKey(SubjectKey::BUY_SIDE_ACCOUNT);
    outer_class_.AddMandatoryKey(SubjectKey::CURRENCY);
    outer_class_.AddMandatoryKey(SubjectKey::CURRENCY_PAIR);
    outer_class_.AddMandatoryKey(SubjectKey::DEAL_TYPE);
    outer_class_.AddMandatoryKey(SubjectKey::QUANTITY);
    outer_class_.AddMandatoryKey(SubjectKey::LIQUIDITY_PROVIDER);
}